

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void * server_listen_(void)

{
  int index;
  ssize_t sVar1;
  Request *req;
  char local_418 [4];
  int last_req;
  char buffer [1000];
  int valread;
  int new_socket;
  int addrlen;
  sockaddr address;
  int server_fd;
  
  address.sa_data._6_4_ = master_fd;
  valread = 0x10;
  printf("\n* Server is listening on port 8000\n* Enter \'q\' to exit\n\n");
  while (listening != 0) {
    buffer._996_4_ = accept(address.sa_data._6_4_,(sockaddr *)&new_socket,(socklen_t *)&valread);
    if ((int)buffer._996_4_ < 0) {
      perror("In accept");
    }
    memset(local_418,0,1000);
    sVar1 = read(buffer._996_4_,local_418,1000);
    buffer._992_4_ = (undefined4)sVar1;
    if ((buffer._992_4_ == 0) || (buffer._992_4_ == -1)) {
      close(buffer._996_4_);
    }
    else {
      index = append_to_requests(local_418,buffer._996_4_);
      req = (Request *)array_list_get(reqs,index);
      process_request(req,reqs);
    }
  }
  return stack0xfffffffffffffff0;
}

Assistant:

void *server_listen_() {
    int server_fd = master_fd;
    struct sockaddr address;
    int addrlen = sizeof(address);
    int new_socket;
    int valread;

    printf("\n* Server is listening on port 8000\n* Enter 'q' to exit\n\n");

    while (listening) {
        if ((new_socket = accept(server_fd, (struct sockaddr *) &address, (socklen_t *) &addrlen)) < 0) {
            perror("In accept");
        }

        char buffer[MAX_REQUEST_LENGTH] = {0};
        valread = read(new_socket, buffer, MAX_REQUEST_LENGTH);
        if (valread == 0 || valread == -1) {
            close(new_socket);
            continue;
        }
#ifdef TESTING
        printf("%s - new request\n", buffer);
#endif
        int last_req = append_to_requests(buffer, new_socket);
        process_request(array_list_get(reqs, last_req), reqs);
    }
}